

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O1

int secp256k1_der_read_len(size_t *len,uchar **sigp,uchar *sigend)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  
  *len = 0;
  pbVar3 = *sigp;
  if (pbVar3 < sigend) {
    pbVar1 = pbVar3 + 1;
    *sigp = pbVar1;
    bVar2 = *pbVar3;
    if ((ulong)bVar2 != 0xff) {
      if (-1 < (char)bVar2) {
        *len = (ulong)bVar2;
        return 1;
      }
      if (bVar2 != 0x80) {
        uVar4 = bVar2 & 0x7f;
        uVar5 = (ulong)uVar4;
        if (((uVar5 <= (ulong)((long)sigend - (long)pbVar1)) && ((byte)uVar4 < 9)) && (*pbVar1 != 0)
           ) {
          if (uVar5 != 0) {
            sVar6 = *len;
            pbVar3 = *sigp;
            do {
              sVar6 = sVar6 << 8 | (ulong)*pbVar3;
              *len = sVar6;
              *sigp = pbVar3 + 1;
              uVar5 = uVar5 - 1;
              pbVar3 = pbVar3 + 1;
            } while (uVar5 != 0);
          }
          if (*len <= (ulong)((long)sigend - (long)*sigp)) {
            return (int)(0x7f < *len);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int secp256k1_der_read_len(size_t *len, const unsigned char **sigp, const unsigned char *sigend) {
    size_t lenleft;
    unsigned char b1;
    VERIFY_CHECK(len != NULL);
    *len = 0;
    if (*sigp >= sigend) {
        return 0;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return 0;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        *len = b1;
        return 1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return 0;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F; /* lenleft is at least 1 */
    if (lenleft > (size_t)(sigend - *sigp)) {
        return 0;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    if (lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * certainly longer than the passed array size.
         */
        return 0;
    }
    while (lenleft > 0) {
        *len = (*len << 8) | **sigp;
        (*sigp)++;
        lenleft--;
    }
    if (*len > (size_t)(sigend - *sigp)) {
        /* Result exceeds the length of the passed array. */
        return 0;
    }
    if (*len < 128) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    return 1;
}